

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

bool add_buf(BUFFER *buffer,char *string)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  void *pvVar5;
  char *in_RSI;
  long in_RDI;
  char *tptr;
  int len;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar6;
  
  if ((*in_RSI == '\0') || (in_RSI == (char *)0x0)) {
    bVar6 = false;
  }
  else {
    if ((*(long *)(in_RDI + 0x10) != 0) && (sVar2 = strlen(*(char **)(in_RDI + 0x10)), sVar2 != 0))
    {
      sVar2 = strlen(*(char **)(in_RDI + 0x10));
      sVar4 = strlen(in_RSI);
      iVar1 = (int)sVar2 + (int)sVar4 + 1;
      if (0x7ffe < iVar1) {
        return true;
      }
      pcVar3 = *(char **)(in_RDI + 0x10);
      pvVar5 = operator_new__((long)iVar1);
      *(void **)(in_RDI + 0x10) = pvVar5;
      if (*(long *)(in_RDI + 0x10) == 0) {
        return false;
      }
      *(short *)(in_RDI + 0xc) = (short)iVar1;
      strcpy(*(char **)(in_RDI + 0x10),pcVar3);
      strcat(*(char **)(in_RDI + 0x10),in_RSI);
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
      }
      return true;
    }
    pcVar3 = palloc_string((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    *(char **)(in_RDI + 0x10) = pcVar3;
    sVar2 = strlen(in_RSI);
    *(short *)(in_RDI + 0xc) = (short)sVar2 + 1;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool add_buf(BUFFER *buffer, char *string)
{
	int len;
	char *tptr;

	if (string[0] == '\0' || string == nullptr)
		return false;

	if (!buffer->string || !strlen(buffer->string)) // like a virgin.. touched for the very first tiiiiime
	{
		buffer->string = palloc_string(string);
		buffer->size = strlen(string) + 1;
		return true;
	}

	len = strlen(buffer->string) + strlen(string) + 1;

	if (len > 32766)
		return true;

	tptr = buffer->string;
	buffer->string = new char[len];

	if (!buffer->string)
		return false;

	buffer->size = len;

	strcpy(buffer->string, tptr);
	strcat(buffer->string, string);

	delete[] tptr;
	return true;
}